

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids::IfcArbitraryProfileDefWithVoids
          (IfcArbitraryProfileDefWithVoids *this)

{
  *(undefined ***)&this->field_0x98 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(char **)&this->field_0xa8 = "IfcArbitraryProfileDefWithVoids";
  IfcArbitraryClosedProfileDef::IfcArbitraryClosedProfileDef
            (&this->super_IfcArbitraryClosedProfileDef,&PTR_construction_vtable_24__007b5718);
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).field_0x78 = 0;
  (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7b5688;
  *(undefined8 *)&this->field_0x98 = 0x7b5700;
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.field_0x58 =
       0x7b56b0;
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).field_0x70 = 0x7b56d8;
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).field_0x80 = 0;
  *(undefined8 *)&this->field_0x88 = 0;
  *(undefined8 *)&this->field_0x90 = 0;
  return;
}

Assistant:

IfcArbitraryProfileDefWithVoids() : Object("IfcArbitraryProfileDefWithVoids") {}